

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp2.c
# Opt level: O3

ReturnCode doif(Global *global,int hash)

{
  int c;
  ReturnCode RVar1;
  undefined8 in_RAX;
  DEFBUF *pDVar2;
  bool bVar3;
  bool bVar4;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  c = skipws(global);
  if ((c == 10) || (c == 0)) {
    unget(global);
LAB_0010390f:
    cerror(global,ERROR_MISSING_ARGUMENT);
    skipnl(global);
    unget(global);
  }
  else {
    if (hash == 0x69) {
      unget(global);
      RVar1 = eval(global,&local_14);
      if (RVar1 != FPP_OK) {
        return RVar1;
      }
      bVar3 = local_14 != 0;
      bVar4 = true;
    }
    else {
      if (type[c] != '\x02') goto LAB_0010390f;
      pDVar2 = lookid(global,c);
      bVar3 = pDVar2 != (DEFBUF *)0x0;
      bVar4 = hash == 0x131;
    }
    if (bVar4 == bVar3) {
      global->ifstack[0] = '\x01';
      *global->ifptr = *global->ifptr | 4;
    }
    else {
      global->ifstack[0] = '\0';
    }
  }
  return FPP_OK;
}

Assistant:

FILE_LOCAL
ReturnCode doif(struct Global *global, int hash)
{
    /*
     * Process an #if, #ifdef, or #ifndef. The latter two are straightforward,
     * while #if needs a subroutine of its own to evaluate the expression.
     *
     * doif() is called only if compiling is TRUE.  If false, compilation
     * is always supressed, so we don't need to evaluate anything.  This
     * supresses unnecessary warnings.
     */

    int c;
    int found;
    ReturnCode ret;

    if( (c = skipws( global ) ) == '\n' || c == EOF_CHAR )
        {
        unget( global );

        cerror( global, ERROR_MISSING_ARGUMENT );

        #if !OLD_PREPROCESSOR
        skipnl( global );               /* Prevent an extra     */

        unget( global );                /* Error message        */
        #endif

        return(FPP_OK);
        }

    if( hash == L_if )
        {
        unget( global );

        ret = eval( global, &found );

        if( ret )
            return( ret );

        found = (found != 0);     /* Evaluate expr, != 0 is  TRUE */

        hash = L_ifdef;       /* #if is now like #ifdef */
        }
    else
        {
        if( type[c] != LET )
            {         /* Next non-blank isn't letter  */
                          /* ... is an error          */
            cerror( global, ERROR_MISSING_ARGUMENT );

            #if !OLD_PREPROCESSOR
            skipnl( global );             /* Prevent an extra     */

            unget( global );              /* Error message        */
            #endif

            return(FPP_OK);
            }

        found = ( lookid( global, c ) != NULL ); /* Look for it in symbol table */
        }

    if( found == (hash == L_ifdef) )
        {
        compiling = TRUE;

        *global->ifptr |= TRUE_SEEN;
        }
    else
        compiling = FALSE;

    return(FPP_OK);
}